

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::CopyingOutputStreamAdaptor
          (CopyingOutputStreamAdaptor *this,CopyingOutputStream *copying_stream,int block_size)

{
  int in_EDX;
  _func_int **in_RSI;
  ZeroCopyOutputStream *in_RDI;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  ZeroCopyOutputStream::ZeroCopyOutputStream(in_RDI);
  in_RDI->_vptr_ZeroCopyOutputStream = (_func_int **)&PTR__CopyingOutputStreamAdaptor_008d5f90;
  in_RDI[1]._vptr_ZeroCopyOutputStream = in_RSI;
  *(undefined1 *)&in_RDI[2]._vptr_ZeroCopyOutputStream = 0;
  *(undefined1 *)((long)&in_RDI[2]._vptr_ZeroCopyOutputStream + 1) = 0;
  in_RDI[3]._vptr_ZeroCopyOutputStream = (_func_int **)0x0;
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<std::default_delete<unsigned_char[]>,void>
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (in_EDX < 1) {
    in_EDX = 0x2000;
  }
  *(int *)&in_RDI[5]._vptr_ZeroCopyOutputStream = in_EDX;
  *(undefined4 *)((long)&in_RDI[5]._vptr_ZeroCopyOutputStream + 4) = 0;
  return;
}

Assistant:

CopyingOutputStreamAdaptor::CopyingOutputStreamAdaptor(
    CopyingOutputStream* copying_stream, int block_size)
    : copying_stream_(copying_stream),
      owns_copying_stream_(false),
      failed_(false),
      position_(0),
      buffer_size_(block_size > 0 ? block_size : kDefaultBlockSize),
      buffer_used_(0) {}